

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_iterator.hpp
# Opt level: O1

void __thiscall
burst::
union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
::increment(union_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::less<void>_>
            *this)

{
  __normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_*,_std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  _Var1;
  iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *piVar2;
  _Val_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  unaff_EBX;
  
  _Var1._M_current = (this->m_begin)._M_current;
  _Var1 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>*,std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>>>,boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__ops::_Val_comp_iter<burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
                    (_Var1,(this->m_end)._M_current,
                     (iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      *)_Var1._M_current,unaff_EBX);
  for (piVar2 = (this->m_begin)._M_current; piVar2 != _Var1._M_current; piVar2 = piVar2 + 1) {
    (piVar2->
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
    ).
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_current =
         (piVar2->
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
         ).
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
         .
         super_iterator_range_base<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
         .m_Begin._M_current + 1;
  }
  maintain_invariant(this);
  return;
}

Assistant:

void increment ()
        {
            auto current_union_end =
                std::upper_bound(m_begin, m_end, *m_begin, each(front) | m_compare);
            std::for_each(m_begin, current_union_end,
                [] (auto & range)
                {
                    range.advance_begin(1);
                });

            maintain_invariant();
        }